

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnCompare_double(void *v1,void *v2)

{
  double *i2;
  double *i1;
  void *v2_local;
  void *v1_local;
  
  if (*v2 <= *v1) {
    if (*v1 < *v2 || *v1 == *v2) {
      v1_local._4_4_ = 0;
    }
    else {
      v1_local._4_4_ = 1;
    }
  }
  else {
    v1_local._4_4_ = -1;
  }
  return v1_local._4_4_;
}

Assistant:

static int FnCompare_double(const void *v1, const void *v2)
{
   const double *i1 = v1;
   const double *i2 = v2;
   
   if (*i1 < *i2)
     return(-1);
   else if (*i1 > *i2)
     return(1);
   else
     return(0);
}